

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memxor.c
# Opt level: O3

void memxor(uint8_t *out,uint8_t *in1,uint8_t *in2,size_t size)

{
  byte bVar1;
  byte bVar2;
  
  switch((uint)size & 0xf) {
  case 0:
    while (0xf < size) {
      size = size - 0x10;
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_f:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_e:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_d:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_c:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_b:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_a:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_9:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_8:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_7:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_6:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_5:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_4:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_3:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_2:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
switchD_00135a3b_caseD_1:
      bVar1 = *in2;
      bVar2 = *in1;
      in2 = in2 + 1;
      in1 = in1 + 1;
      *out = bVar1 ^ bVar2;
      out = out + 1;
    }
    break;
  case 1:
    goto switchD_00135a3b_caseD_1;
  case 2:
    goto switchD_00135a3b_caseD_2;
  case 3:
    goto switchD_00135a3b_caseD_3;
  case 4:
    goto switchD_00135a3b_caseD_4;
  case 5:
    goto switchD_00135a3b_caseD_5;
  case 6:
    goto switchD_00135a3b_caseD_6;
  case 7:
    goto switchD_00135a3b_caseD_7;
  case 8:
    goto switchD_00135a3b_caseD_8;
  case 9:
    goto switchD_00135a3b_caseD_9;
  case 10:
    goto switchD_00135a3b_caseD_a;
  case 0xb:
    goto switchD_00135a3b_caseD_b;
  case 0xc:
    goto switchD_00135a3b_caseD_c;
  case 0xd:
    goto switchD_00135a3b_caseD_d;
  case 0xe:
    goto switchD_00135a3b_caseD_e;
  case 0xf:
    goto switchD_00135a3b_caseD_f;
  }
  return;
}

Assistant:

void memxor(uint8_t *out, const uint8_t *in1, const uint8_t *in2, size_t size)
{
    switch (size & 15) {
      case 0:
        while (size >= 16) {
            size -= 16;
                   *out++ = *in1++ ^ *in2++;
          case 15: *out++ = *in1++ ^ *in2++;
          case 14: *out++ = *in1++ ^ *in2++;
          case 13: *out++ = *in1++ ^ *in2++;
          case 12: *out++ = *in1++ ^ *in2++;
          case 11: *out++ = *in1++ ^ *in2++;
          case 10: *out++ = *in1++ ^ *in2++;
          case 9:  *out++ = *in1++ ^ *in2++;
          case 8:  *out++ = *in1++ ^ *in2++;
          case 7:  *out++ = *in1++ ^ *in2++;
          case 6:  *out++ = *in1++ ^ *in2++;
          case 5:  *out++ = *in1++ ^ *in2++;
          case 4:  *out++ = *in1++ ^ *in2++;
          case 3:  *out++ = *in1++ ^ *in2++;
          case 2:  *out++ = *in1++ ^ *in2++;
          case 1:  *out++ = *in1++ ^ *in2++;
        }
    }
}